

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

saint_t inverse_bw_transform(sauchar_t *T,sauchar_t *U,saidx_t *A,saidx_t n,saidx_t idx)

{
  byte *pbVar1;
  saidx_t *__ptr;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  saint_t sVar11;
  ulong uVar12;
  sauchar_t D [256];
  saidx_t C [256];
  
  sVar11 = -1;
  if (((((idx <= n) && (T != (sauchar_t *)0x0)) && (U != (sauchar_t *)0x0)) &&
      ((-1 < (idx | n) && (n < 1 || idx != 0)))) && (sVar11 = 0, 1 < n)) {
    uVar12 = (ulong)(uint)n;
    __ptr = A;
    if ((A == (saidx_t *)0x0) && (__ptr = (saidx_t *)malloc(uVar12 * 4), __ptr == (saidx_t *)0x0)) {
      return -2;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      C[lVar3] = 0;
    }
    for (uVar4 = 0; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      C[T[uVar4]] = C[T[uVar4]] + 1;
    }
    iVar5 = 0;
    uVar2 = 0;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar10 = C[lVar3];
      if (0 < iVar10) {
        C[lVar3] = iVar5;
        lVar9 = (long)(int)uVar2;
        uVar2 = uVar2 + 1;
        D[lVar9] = (sauchar_t)lVar3;
        iVar5 = iVar5 + iVar10;
      }
    }
    uVar8 = 0;
    uVar4 = 0;
    if (0 < idx) {
      uVar4 = (ulong)(uint)idx;
    }
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      iVar5 = C[T[uVar8]];
      C[T[uVar8]] = iVar5 + 1;
      __ptr[iVar5] = (saidx_t)uVar8;
    }
    while (uVar4 < uVar12) {
      pbVar1 = T + uVar4;
      uVar4 = uVar4 + 1;
      iVar5 = C[*pbVar1];
      C[*pbVar1] = iVar5 + 1;
      __ptr[iVar5] = (saidx_t)uVar4;
    }
    uVar4 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      C[uVar4] = C[D[uVar4]];
    }
    for (uVar4 = 0; uVar4 != uVar12; uVar4 = uVar4 + 1) {
      iVar5 = 0;
      uVar7 = uVar2;
      while (0 < (int)uVar7) {
        uVar6 = uVar7 >> 1;
        iVar10 = iVar5 + 1 + uVar6;
        if (idx <= C[(int)(iVar5 + uVar6)]) {
          iVar10 = iVar5;
        }
        uVar7 = uVar6 - ((uint)(C[(int)(iVar5 + uVar6)] < idx) & ~uVar7);
        iVar5 = iVar10;
      }
      U[uVar4] = D[iVar5];
      idx = __ptr[(long)idx + -1];
    }
    sVar11 = 0;
    if (A == (saidx_t *)0x0) {
      free(__ptr);
    }
  }
  return sVar11;
}

Assistant:

saint_t
inverse_bw_transform(const sauchar_t *T, sauchar_t *U, saidx_t *A,
                     saidx_t n, saidx_t idx) {
  saidx_t C[ALPHABET_SIZE];
  sauchar_t D[ALPHABET_SIZE];
  saidx_t *B;
  saidx_t i, p;
  saint_t c, d;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0) || (idx < 0) ||
     (n < idx) || ((0 < n) && (idx == 0))) {
    return -1;
  }
  if(n <= 1) { return 0; }

  if((B = A) == NULL) {
    /* Allocate n*sizeof(saidx_t) bytes of memory. */
    if((B = (saidx_t *)malloc((size_t)n * sizeof(saidx_t))) == NULL) { return -2; }
  }

  /* Inverse BW transform. */
  for(c = 0; c < ALPHABET_SIZE; ++c) { C[c] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(c = 0, d = 0, i = 0; c < ALPHABET_SIZE; ++c) {
    p = C[c];
    if(0 < p) {
      C[c] = i;
      D[d++] = (sauchar_t)c;
      i += p;
    }
  }
  for(i = 0; i < idx; ++i) { B[C[T[i]]++] = i; }
  for( ; i < n; ++i)       { B[C[T[i]]++] = i + 1; }
  for(c = 0; c < d; ++c) { C[c] = C[D[c]]; }
  for(i = 0, p = idx; i < n; ++i) {
    U[i] = D[binarysearch_lower(C, d, p)];
    p = B[p - 1];
  }

  if(A == NULL) {
    /* Deallocate memory. */
    free(B);
  }

  return 0;
}